

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterWriteElementNS
              (xmlTextWriterPtr writer,xmlChar *prefix,xmlChar *name,xmlChar *namespaceURI,
              xmlChar *content)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int sum;
  int count;
  xmlChar *content_local;
  xmlChar *namespaceURI_local;
  xmlChar *name_local;
  xmlChar *prefix_local;
  xmlTextWriterPtr writer_local;
  
  if (((writer == (xmlTextWriterPtr)0x0) || (name == (xmlChar *)0x0)) || (*name == '\0')) {
    writer_local._4_4_ = -1;
  }
  else {
    iVar1 = xmlTextWriterStartElementNS(writer,prefix,name,namespaceURI);
    if (iVar1 < 0) {
      writer_local._4_4_ = -1;
    }
    else {
      iVar2 = xmlTextWriterWriteString(writer,content);
      if (iVar2 == -1) {
        writer_local._4_4_ = -1;
      }
      else {
        iVar3 = xmlTextWriterEndElement(writer);
        if (iVar3 == -1) {
          writer_local._4_4_ = -1;
        }
        else {
          writer_local._4_4_ = iVar3 + iVar2 + iVar1;
        }
      }
    }
  }
  return writer_local._4_4_;
}

Assistant:

int
xmlTextWriterWriteElementNS(xmlTextWriterPtr writer,
                            const xmlChar * prefix, const xmlChar * name,
                            const xmlChar * namespaceURI,
                            const xmlChar * content)
{
    int count;
    int sum;

    if ((writer == NULL) || (name == NULL) || (*name == '\0'))
        return -1;

    sum = 0;
    count =
        xmlTextWriterStartElementNS(writer, prefix, name, namespaceURI);
    if (count < 0)
        return -1;
    sum += count;
    count = xmlTextWriterWriteString(writer, content);
    if (count == -1)
        return -1;
    sum += count;
    count = xmlTextWriterEndElement(writer);
    if (count == -1)
        return -1;
    sum += count;

    return sum;
}